

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZEllipse3D>::X
          (TPZGeoElRefLess<pzgeom::TPZEllipse3D> *this,TPZVec<Fad<double>_> *coordinate,
          TPZVec<Fad<double>_> *result)

{
  TPZFNMatrix<54,_double> cornerco;
  
  (*result->_vptr_TPZVec[3])(result,3);
  TPZFNMatrix<54,_double>::TPZFNMatrix(&cornerco,3,2);
  CornerCoordinates(this,&cornerco.super_TPZFMatrix<double>);
  pzgeom::TPZEllipse3D::X<Fad<double>>
            (&this->fGeo,&cornerco.super_TPZFMatrix<double>,coordinate,result);
  TPZFNMatrix<54,_double>::~TPZFNMatrix(&cornerco);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::X(TPZVec<Fad<REAL> > &coordinate,TPZVec<Fad<REAL> > &result) const {
    result.Resize(3);
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
    fGeo.X(cornerco,coordinate,result);
}